

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void codestring(LexState *ls,expdesc *e,TString *s)

{
  int info;
  TString *s_local;
  expdesc *e_local;
  LexState *ls_local;
  
  info = luaK_stringK(ls->fs,s);
  init_exp(e,VK,info,0x100,(TString *)0x0);
  return;
}

Assistant:

static void codestring (LexState *ls, expdesc *e, TString *s) {
  init_exp(e, VK, luaK_stringK(ls->fs, s), RAVI_TM_STRING, NULL);
}